

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_error.h
# Opt level: O2

void __thiscall nodecpp::error::system_error::system_error(system_error *this,errc code)

{
  error_value *peVar1;
  std_error_value sStack_68;
  
  std_error_value::std_error_value(&sStack_68,code);
  peVar1 = std_error_domain::create_value((std_error_domain *)&std_error_domain_obj,&sStack_68);
  (this->super_error).domain_ = (error_domain *)&std_error_domain_obj;
  (this->super_error).value_ = peVar1;
  error_value::~error_value(&sStack_68.super_error_value);
  return;
}

Assistant:

system_error(errc code) : error( &std_error_domain_obj, std_error_domain_obj.create_value(code) ) {}